

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::emitMessages
               (DebugMessageTestContext *ctx,GLenum source)

{
  GLenum type_00;
  undefined4 id;
  char *pcVar1;
  GLchar *buf;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string msg;
  GLenum severity;
  GLenum type;
  int severityNdx;
  int typeNdx;
  GLenum source_local;
  DebugMessageTestContext *ctx_local;
  
  for (type = 0; (int)type < 9; type = type + 1) {
    for (severity = 0; (int)severity < 4; severity = severity + 1) {
      type_00 = *(GLenum *)((anonymous_namespace)::s_debugTypes + (long)(int)type * 4);
      msg.field_2._12_4_ =
           *(undefined4 *)((anonymous_namespace)::s_debugSeverities + (long)(int)severity * 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Application generated message with type ",&local_a9);
      pcVar1 = glu::getDebugMessageTypeName(type_00);
      std::operator+(&local_88,&local_a8,pcVar1);
      std::operator+(&local_68,&local_88," and severity ");
      pcVar1 = glu::getDebugMessageSeverityName(msg.field_2._12_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     &local_68,pcVar1);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      id = msg.field_2._12_4_;
      buf = (GLchar *)std::__cxx11::string::c_str();
      glu::CallLogWrapper::glDebugMessageInsert((CallLogWrapper *)ctx,source,type_00,id,id,-1,buf);
      DebugMessageTestContext::expectMessage(ctx,source,type_00);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  return;
}

Assistant:

void emitMessages (DebugMessageTestContext& ctx, GLenum source)
{
	for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_debugTypes); typeNdx++)
	{
		for (int severityNdx = 0; severityNdx < DE_LENGTH_OF_ARRAY(s_debugSeverities); severityNdx++)
		{
			const GLenum type		= s_debugTypes[typeNdx];
			const GLenum severity	= s_debugSeverities[severityNdx];
			const string msg		= string("Application generated message with type ") + glu::getDebugMessageTypeName(type)
									  + " and severity " + glu::getDebugMessageSeverityName(severity);

			// Use severity as ID, guaranteed unique
			ctx.glDebugMessageInsert(source, type, severity, severity, -1, msg.c_str());
			ctx.expectMessage(source, type);
		}
	}
}